

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::RelocateCallDirectToHelperPath
          (Lowerer *this,Instr *argoutInlineSpecialized,LabelInstr *labelHelper)

{
  _func_int **pp_Var1;
  Instr *pIVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  Opnd *this_00;
  
  this_00 = argoutInlineSpecialized->m_src2;
  IR::Instr::Unlink(argoutInlineSpecialized);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,argoutInlineSpecialized);
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 == OpndKindSym) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      OVar4 = IR::Opnd::GetKind(this_00);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_005eadc7;
        *puVar6 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_005eadc7;
        *puVar6 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x5237,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar5) goto LAB_005eadc7;
        *puVar6 = 0;
      }
      pIVar2 = (Instr *)pp_Var1[5];
      if (pIVar2->m_opcode != ArgOut_A) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x5239,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                           "argInstr->m_opcode == Js::OpCode::ArgOut_A");
        if (!bVar5) goto LAB_005eadc7;
        *puVar6 = 0;
      }
      IR::Instr::Unlink(pIVar2);
      IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar2);
      this_00 = pIVar2->m_src2;
      OVar4 = IR::Opnd::GetKind(this_00);
    } while (OVar4 == OpndKindSym);
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5242,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
    if (!bVar5) goto LAB_005eadc7;
    *puVar6 = 0;
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005eadc7;
    *puVar6 = 0;
  }
  pp_Var1 = this_00[1]._vptr_Opnd;
  if (((ulong)pp_Var1[3] & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5244,"(sym->m_isSingleDef)","sym->m_isSingleDef");
    if (!bVar5) goto LAB_005eadc7;
    *puVar6 = 0;
  }
  pIVar2 = (Instr *)pp_Var1[5];
  if (pIVar2->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5246,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) {
LAB_005eadc7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  IR::Instr::Unlink(pIVar2);
  IR::Instr::InsertAfter(&labelHelper->super_Instr,pIVar2);
  return;
}

Assistant:

void
Lowerer::RelocateCallDirectToHelperPath(IR::Instr* argoutInlineSpecialized, IR::LabelInstr* labelHelper)
{
    IR::Opnd *linkOpnd = argoutInlineSpecialized->GetSrc2(); //ArgOut_A_InlineSpecialized src2; link to actual argouts.

    argoutInlineSpecialized->Unlink();
    labelHelper->InsertAfter(argoutInlineSpecialized);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A);

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);
}